

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int amqpvalue_get_sasl_init(AMQP_VALUE value,SASL_INIT_HANDLE *sasl_init_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  SASL_INIT_HANDLE pSVar4;
  AMQP_VALUE pAVar5;
  AMQP_VALUE pAVar6;
  uint32_t list_item_count;
  char *mechanism;
  
  pSVar4 = (SASL_INIT_HANDLE)malloc(8);
  if (pSVar4 == (SASL_INIT_HANDLE)0x0) {
    *sasl_init_handle = (SASL_INIT_HANDLE)0x0;
    iVar3 = 0x2955;
  }
  else {
    pSVar4->composite_value = (AMQP_VALUE)0x0;
    *sasl_init_handle = pSVar4;
    pAVar5 = amqpvalue_get_inplace_described_value(value);
    if (pAVar5 == (AMQP_VALUE)0x0) {
      sasl_init_destroy(*sasl_init_handle);
      iVar3 = 0x295d;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAVar5,&list_item_count);
      iVar3 = 0x2964;
      if (iVar1 == 0) {
        if (list_item_count == 0) {
          iVar3 = 0x2991;
        }
        else {
          pAVar6 = amqpvalue_get_list_item(pAVar5,0);
          if (pAVar6 == (AMQP_VALUE)0x0) {
            sasl_init_destroy(*sasl_init_handle);
            iVar3 = 0x2973;
          }
          else {
            AVar2 = amqpvalue_get_type(pAVar6);
            if (AVar2 == AMQP_TYPE_NULL) {
              amqpvalue_destroy(pAVar6);
              sasl_init_destroy(*sasl_init_handle);
              iVar3 = 0x297d;
            }
            else {
              iVar3 = amqpvalue_get_symbol(pAVar6,&mechanism);
              if (iVar3 == 0) {
                amqpvalue_destroy(pAVar6);
                if (1 < list_item_count) {
                  pAVar6 = amqpvalue_get_list_item(pAVar5,1);
                  if (pAVar6 != (AMQP_VALUE)0x0) {
                    AVar2 = amqpvalue_get_type(pAVar6);
                    if ((AVar2 != AMQP_TYPE_NULL) &&
                       (iVar3 = amqpvalue_get_binary(pAVar6,(amqp_binary *)&mechanism), iVar3 != 0))
                    {
                      amqpvalue_destroy(pAVar6);
                      sasl_init_destroy(*sasl_init_handle);
                      return 0x29a9;
                    }
                    amqpvalue_destroy(pAVar6);
                  }
                  if ((2 < list_item_count) &&
                     (pAVar5 = amqpvalue_get_list_item(pAVar5,2), pAVar5 != (AMQP_VALUE)0x0)) {
                    AVar2 = amqpvalue_get_type(pAVar5);
                    if ((AVar2 != AMQP_TYPE_NULL) &&
                       (iVar3 = amqpvalue_get_string(pAVar5,&mechanism), iVar3 != 0)) {
                      amqpvalue_destroy(pAVar5);
                      sasl_init_destroy(*sasl_init_handle);
                      return 0x29c6;
                    }
                    amqpvalue_destroy(pAVar5);
                  }
                }
                pAVar5 = amqpvalue_clone(value);
                pSVar4->composite_value = pAVar5;
                iVar3 = 0;
              }
              else {
                amqpvalue_destroy(pAVar6);
                sasl_init_destroy(*sasl_init_handle);
                iVar3 = 0x2987;
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int amqpvalue_get_sasl_init(AMQP_VALUE value, SASL_INIT_HANDLE* sasl_init_handle)
{
    int result;
    SASL_INIT_INSTANCE* sasl_init_instance = (SASL_INIT_INSTANCE*)sasl_init_create_internal();
    *sasl_init_handle = sasl_init_instance;
    if (*sasl_init_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            sasl_init_destroy(*sasl_init_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* mechanism */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                sasl_init_destroy(*sasl_init_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                sasl_init_destroy(*sasl_init_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                const char* mechanism;
                                if (amqpvalue_get_symbol(item_value, &mechanism) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    sasl_init_destroy(*sasl_init_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* initial-response */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                amqp_binary initial_response;
                                if (amqpvalue_get_binary(item_value, &initial_response) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    sasl_init_destroy(*sasl_init_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* hostname */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* hostname;
                                if (amqpvalue_get_string(item_value, &hostname) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    sasl_init_destroy(*sasl_init_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    sasl_init_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}